

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int skip_map_or_array(MMDB_s *mmdb,MMDB_entry_data_s *entry_data)

{
  int status_3;
  int status_4;
  uint32_t size_1;
  int status;
  int status_2;
  int status_1;
  uint32_t size;
  MMDB_entry_data_s *entry_data_local;
  MMDB_s *mmdb_local;
  
  if (entry_data->type == 7) {
    status_2 = entry_data->data_size;
    do {
      if (status_2 == 0) goto LAB_001051b2;
      mmdb_local._4_4_ = decode_one(mmdb,entry_data->offset_to_next,entry_data);
    } while (((mmdb_local._4_4_ == 0) &&
             (mmdb_local._4_4_ = decode_one(mmdb,entry_data->offset_to_next,entry_data),
             mmdb_local._4_4_ == 0)) &&
            (mmdb_local._4_4_ = skip_map_or_array(mmdb,entry_data), status_2 = status_2 + -1,
            mmdb_local._4_4_ == 0));
  }
  else if (entry_data->type == 0xb) {
    status_3 = entry_data->data_size;
    do {
      if (status_3 == 0) goto LAB_001051b2;
      mmdb_local._4_4_ = decode_one(mmdb,entry_data->offset_to_next,entry_data);
    } while ((mmdb_local._4_4_ == 0) &&
            (mmdb_local._4_4_ = skip_map_or_array(mmdb,entry_data), status_3 = status_3 + -1,
            mmdb_local._4_4_ == 0));
  }
  else {
LAB_001051b2:
    mmdb_local._4_4_ = 0;
  }
  return mmdb_local._4_4_;
}

Assistant:

static int skip_map_or_array(const MMDB_s *const mmdb,
                             MMDB_entry_data_s *entry_data) {
    if (entry_data->type == MMDB_DATA_TYPE_MAP) {
        uint32_t size = entry_data->data_size;
        while (size-- > 0) {
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // key
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // value
            int status = skip_map_or_array(mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                return status;
            }
        }
    } else if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
        uint32_t size = entry_data->data_size;
        while (size-- > 0) {
            CHECKED_DECODE_ONE(
                mmdb, entry_data->offset_to_next, entry_data); // value
            int status = skip_map_or_array(mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                return status;
            }
        }
    }

    return MMDB_SUCCESS;
}